

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

size_t __thiscall
ContextSpecificHolder<Extensions,_(unsigned_char)'\xa3',_(OptionType)1>::EncodedSize
          (ContextSpecificHolder<Extensions,_(unsigned_char)__xa3_,_(OptionType)1> *this)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (this->innerType).super_DerBase.cbData;
  lVar2 = 2;
  if ((((0x7f < uVar3) && (lVar2 = 3, 0xff < uVar3)) && (lVar2 = 4, 0xffff < uVar3)) &&
     (((lVar2 = 5, 0xffffff < uVar3 && (lVar2 = 6, uVar3 >> 0x20 != 0)) &&
      (lVar2 = 7, uVar3 >> 0x28 != 0)))) {
    lVar2 = (ulong)(uVar3 >> 0x30 == 0) << 3;
  }
  uVar3 = lVar2 + uVar3;
  if (uVar3 < 3) {
    sVar1 = 0;
  }
  else {
    lVar2 = 2;
    if (((0x7f < uVar3) && (lVar2 = 3, 0xff < uVar3)) &&
       ((lVar2 = 4, 0xffff < uVar3 &&
        (((lVar2 = 5, 0xffffff < uVar3 && (lVar2 = 6, uVar3 >> 0x20 != 0)) &&
         (lVar2 = 7, uVar3 >> 0x28 != 0)))))) {
      lVar2 = (ulong)(uVar3 >> 0x30 == 0) << 3;
    }
    sVar1 = lVar2 + uVar3;
  }
  return sVar1;
}

Assistant:

size_t EncodedSize()
	{
		size_t innerSize = innerType.EncodedSize();

        // if innerType decodes to null, then this isn't present
        // Mirror the logic in Encode
        if (innerSize <= 2)
            return 0;

		return 1 + GetSizeBytes(innerSize) + innerSize;
	}